

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O0

bool __thiscall
GraphContigger::solve_unclassified(GraphContigger *this,TangleView *t,Strider *s,GraphEditor *ge)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  sgNodeID_t sVar4;
  reference plVar5;
  iterator iVar6;
  reference p;
  size_type sVar7;
  reference this_00;
  SequenceDistanceGraphPath *in_RCX;
  vector<NodeView,_std::allocator<NodeView>_> *in_RSI;
  __enable_if_t<is_constructible<value_type,_pair<long,_vector<long>_>_&&>::value,_pair<iterator,_bool>_>
  _Var8;
  pair<std::__detail::_Node_iterator<long,_true,_false>,_bool> pVar9;
  bool in_stack_0000002d;
  bool in_stack_0000002e;
  bool in_stack_0000002f;
  sgNodeID_t in_stack_00000030;
  Strider *in_stack_00000038;
  NodeView *x_5;
  iterator __end2_3;
  iterator __begin2_3;
  vector<NodeView,_std::allocator<NodeView>_> *__range2_3;
  vector<long,_std::allocator<long>_> *x_4;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range2_2;
  string ps;
  vector<long,_std::allocator<long>_> *x_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range2_1;
  vector<long,_std::allocator<long>_> *x_2;
  iterator __end1_7;
  iterator __begin1_7;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range1_7;
  vector<long,_std::allocator<long>_> *x_1;
  iterator __end1_6;
  iterator __begin1_6;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range1_6;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> temp_set;
  vector<long,_std::allocator<long>_> sol;
  vector<long,_std::allocator<long>_> *x;
  iterator __end1_5;
  iterator __begin1_5;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range1_5;
  pair<const_long,_std::vector<long,_std::allocator<long>_>_> *v_1;
  iterator __end1_4;
  iterator __begin1_4;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  *__range1_4;
  pair<const_long,_std::vector<long,_std::allocator<long>_>_> *v;
  iterator __end1_3;
  iterator __begin1_3;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  *__range1_3;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  map_values;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  sols;
  long *i_1;
  iterator __end2;
  iterator __begin2;
  vector<long,_std::allocator<long>_> *__range2;
  reverse_iterator i;
  vector<long,_std::allocator<long>_> stride_back;
  vector<long,_std::allocator<long>_> tpath;
  NodeView *nv;
  iterator __end1_2;
  iterator __begin1_2;
  vector<NodeView,_std::allocator<NodeView>_> *__range1_2;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  ns;
  NodeView *f_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<NodeView,_std::allocator<NodeView>_> *__range1_1;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  fs;
  NodeView *f;
  iterator __end1;
  iterator __begin1;
  vector<NodeView,_std::allocator<NodeView>_> *__range1;
  vector<long,_std::allocator<long>_> fnids;
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  *in_stack_fffffffffffffa28;
  SequenceDistanceGraphPath *in_stack_fffffffffffffa30;
  SequenceDistanceGraph *in_stack_fffffffffffffa38;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  in_stack_fffffffffffffa40;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  in_stack_fffffffffffffa48;
  _Node_iterator_base<long,_false> in_stack_fffffffffffffa78;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffa80;
  bool local_56a;
  __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_> local_4d0;
  vector<NodeView,_std::allocator<NodeView>_> *local_4c8;
  reference local_4a8;
  vector<long,_std::allocator<long>_> *local_4a0;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  local_498;
  vector<long,_std::allocator<long>_> *local_490;
  undefined4 local_484;
  sgNodeID_t in_stack_fffffffffffffb88;
  GraphEditor *in_stack_fffffffffffffb90;
  string local_448 [32];
  reference local_428;
  vector<long,_std::allocator<long>_> *local_420;
  vector<long,_std::allocator<long>_> *nodes;
  _Node_iterator_base<long,_false> in_stack_fffffffffffffbf8;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  local_3e0;
  vector<long,_std::allocator<long>_> *local_3d8;
  _Node_iterator_base<long,_false> local_3d0;
  undefined1 local_3c8;
  reference local_3c0;
  vector<long,_std::allocator<long>_> *local_3b8;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  local_3b0;
  vector<long,_std::allocator<long>_> *local_3a8;
  vector<long,_std::allocator<long>_> *local_368;
  vector<long,_std::allocator<long>_> *local_360;
  vector<long,_std::allocator<long>_> *local_358;
  vector<long,_std::allocator<long>_> *local_350;
  SequenceDistanceGraphPath *in_stack_fffffffffffffce8;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffcf8;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  local_2f0;
  undefined1 *local_2e8;
  reference local_2e0;
  _Node_iterator_base<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false>
  local_2d8;
  _Node_iterator_base<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false>
  local_2d0;
  undefined1 *local_2c8;
  reference local_2c0;
  _Node_iterator_base<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false>
  local_2b8;
  _Node_iterator_base<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false>
  local_2b0;
  undefined1 *local_2a8;
  undefined1 local_2a0 [24];
  vector<long,_std::allocator<long>_> local_288;
  _Node_iterator_base<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false>
  local_270;
  undefined1 local_268;
  sgNodeID_t local_260;
  long local_238;
  reference local_230;
  long *local_228;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_220;
  undefined1 local_218 [32];
  undefined1 *local_1f8;
  long local_1f0;
  NodeView *local_180;
  NodeView *local_178;
  __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_> local_170;
  vector<NodeView,_std::allocator<NodeView>_> *local_168;
  undefined1 local_160 [56];
  _Node_iterator_base<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false>
  local_128;
  undefined1 local_120;
  long local_f8;
  NodeView *local_d0;
  NodeView *local_c8;
  __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_> local_c0;
  vector<NodeView,_std::allocator<NodeView>_> *local_b8;
  undefined1 local_b0 [72];
  sgNodeID_t local_68;
  reference local_60;
  NodeView *local_58;
  __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_> local_50;
  vector<NodeView,_std::allocator<NodeView>_> *local_48;
  vector<long,_std::allocator<long>_> local_40;
  SequenceDistanceGraphPath *local_28;
  vector<NodeView,_std::allocator<NodeView>_> *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  sVar2 = std::vector<NodeView,_std::allocator<NodeView>_>::size(in_RSI);
  sVar3 = std::vector<NodeView,_std::allocator<NodeView>_>::size(local_18 + 1);
  if (200 < sVar2 + sVar3) {
    local_1 = 0;
    goto LAB_004c0c1e;
  }
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x4bfb8d);
  local_48 = local_18;
  local_50._M_current =
       (NodeView *)
       std::vector<NodeView,_std::allocator<NodeView>_>::begin
                 ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffa28);
  local_58 = (NodeView *)
             std::vector<NodeView,_std::allocator<NodeView>_>::end
                       ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffa28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)in_stack_fffffffffffffa30,
                            (__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)in_stack_fffffffffffffa28), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
               operator*(&local_50);
    local_68 = NodeView::node_id(local_60);
    std::vector<long,_std::allocator<long>_>::push_back
              (&in_stack_fffffffffffffa30->nodes,(value_type *)in_stack_fffffffffffffa28);
    __gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
    operator++(&local_50);
  }
  std::
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  ::unordered_map((unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
                   *)0x4bfc6c);
  local_b8 = local_18;
  local_c0._M_current =
       (NodeView *)
       std::vector<NodeView,_std::allocator<NodeView>_>::begin
                 ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffa28);
  local_c8 = (NodeView *)
             std::vector<NodeView,_std::allocator<NodeView>_>::end
                       ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffa28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)in_stack_fffffffffffffa30,
                            (__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)in_stack_fffffffffffffa28), bVar1) {
    local_d0 = __gnu_cxx::
               __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
               operator*(&local_c0);
    sVar4 = NodeView::node_id(local_d0);
    local_f8 = -sVar4;
    NodeView::node_id(local_d0);
    Strider::stride_out_in_order
              (in_stack_00000038,in_stack_00000030,in_stack_0000002f,in_stack_0000002e,
               in_stack_0000002d);
    std::make_pair<long,std::vector<long,std::allocator<long>>>
              ((long *)in_stack_fffffffffffffa38,&in_stack_fffffffffffffa30->nodes);
    _Var8 = std::
            unordered_map<long,std::vector<long,std::allocator<long>>,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>>
            ::insert<std::pair<long,std::vector<long,std::allocator<long>>>>
                      ((unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
                        *)in_stack_fffffffffffffa40._M_current,
                       (pair<long,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_fffffffffffffa38);
    local_128._M_cur =
         (__node_type *)
         _Var8.first.
         super__Node_iterator_base<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false>
         ._M_cur;
    local_120 = _Var8.second;
    std::pair<long,_std::vector<long,_std::allocator<long>_>_>::~pair
              ((pair<long,_std::vector<long,_std::allocator<long>_>_> *)0x4bfdc8);
    SequenceDistanceGraphPath::~SequenceDistanceGraphPath((SequenceDistanceGraphPath *)0x4bfdd5);
    __gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
    operator++(&local_c0);
  }
  std::
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  ::unordered_map((unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
                   *)0x4bfe56);
  local_168 = local_18 + 1;
  local_170._M_current =
       (NodeView *)
       std::vector<NodeView,_std::allocator<NodeView>_>::begin
                 ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffa28);
  local_178 = (NodeView *)
              std::vector<NodeView,_std::allocator<NodeView>_>::end
                        ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffa28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)in_stack_fffffffffffffa30,
                            (__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                             *)in_stack_fffffffffffffa28), bVar1) {
    local_180 = __gnu_cxx::
                __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
                operator*(&local_170);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)0x4bfed4);
    NodeView::node_id(local_180);
    Strider::stride_out_in_order
              (in_stack_00000038,in_stack_00000030,in_stack_0000002f,in_stack_0000002e,
               in_stack_0000002d);
    std::vector<long,_std::allocator<long>_>::vector
              (&in_stack_fffffffffffffa30->nodes,
               (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa28);
    SequenceDistanceGraphPath::~SequenceDistanceGraphPath((SequenceDistanceGraphPath *)0x4bff4b);
    std::vector<long,_std::allocator<long>_>::rbegin
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa38);
    while( true ) {
      std::vector<long,_std::allocator<long>_>::rend
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa38);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
      ::operator-((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                   *)in_stack_fffffffffffffa48._M_current,
                  (difference_type)in_stack_fffffffffffffa40._M_current);
      bVar1 = std::operator<((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                              *)in_stack_fffffffffffffa40._M_current,
                             (reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                              *)in_stack_fffffffffffffa38);
      if (!bVar1) break;
      plVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                            *)in_stack_fffffffffffffa30);
      local_1f0 = -*plVar5;
      std::vector<long,_std::allocator<long>_>::push_back
                (&in_stack_fffffffffffffa30->nodes,(value_type *)in_stack_fffffffffffffa28);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                    *)in_stack_fffffffffffffa30);
    }
    NodeView::node_id(local_180);
    Strider::stride_out_in_order
              (in_stack_00000038,in_stack_00000030,in_stack_0000002f,in_stack_0000002e,
               in_stack_0000002d);
    local_1f8 = local_218;
    local_220._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::begin
                           ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa28);
    local_228 = (long *)std::vector<long,_std::allocator<long>_>::end
                                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa28)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffa30,
                              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffa28), bVar1) {
      local_230 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator*(&local_220);
      local_238 = *local_230 + -1;
      std::vector<long,_std::allocator<long>_>::push_back
                (&in_stack_fffffffffffffa30->nodes,(value_type *)in_stack_fffffffffffffa28);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&local_220);
    }
    SequenceDistanceGraphPath::~SequenceDistanceGraphPath((SequenceDistanceGraphPath *)0x4c0105);
    local_260 = NodeView::node_id(local_180);
    std::make_pair<long,std::vector<long,std::allocator<long>>&>
              ((long *)in_stack_fffffffffffffa38,&in_stack_fffffffffffffa30->nodes);
    _Var8 = std::
            unordered_map<long,std::vector<long,std::allocator<long>>,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>>
            ::insert<std::pair<long,std::vector<long,std::allocator<long>>>>
                      ((unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
                        *)in_stack_fffffffffffffa40._M_current,
                       (pair<long,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_fffffffffffffa38);
    local_270._M_cur =
         (__node_type *)
         _Var8.first.
         super__Node_iterator_base<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false>
         ._M_cur;
    local_268 = _Var8.second;
    std::pair<long,_std::vector<long,_std::allocator<long>_>_>::~pair
              ((pair<long,_std::vector<long,_std::allocator<long>_>_> *)0x4c0205);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffa40._M_current);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffa40._M_current);
    __gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
    operator++(&local_170);
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)0x4c027e);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)0x4c028b);
  local_2a8 = local_b0;
  local_2b0._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
       ::begin(in_stack_fffffffffffffa28);
  local_2b8._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
       ::end(in_stack_fffffffffffffa28);
  while (bVar1 = std::__detail::operator!=(&local_2b0,&local_2b8), bVar1) {
    local_2c0 = std::__detail::
                _Node_iterator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false,_false>
                ::operator*((_Node_iterator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false,_false>
                             *)0x4c02ed);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffffa40._M_current,(value_type *)in_stack_fffffffffffffa38);
    std::__detail::
    _Node_iterator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false,_false>
                *)in_stack_fffffffffffffa30);
  }
  local_2c8 = local_160;
  local_2d0._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
       ::begin(in_stack_fffffffffffffa28);
  local_2d8._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
       ::end(in_stack_fffffffffffffa28);
  while (bVar1 = std::__detail::operator!=(&local_2d0,&local_2d8), bVar1) {
    local_2e0 = std::__detail::
                _Node_iterator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false,_false>
                ::operator*((_Node_iterator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false,_false>
                             *)0x4c039c);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffffa40._M_current,(value_type *)in_stack_fffffffffffffa38);
    std::__detail::
    _Node_iterator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>,_false,_false>
                *)in_stack_fffffffffffffa30);
  }
  local_2e8 = local_2a0;
  local_2f0._M_current =
       (vector<long,_std::allocator<long>_> *)
       std::
       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
       ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)in_stack_fffffffffffffa28);
  iVar6 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffffa28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                             *)in_stack_fffffffffffffa30,
                            (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                             *)in_stack_fffffffffffffa28), bVar1) {
    p = __gnu_cxx::
        __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
        ::operator*(&local_2f0);
    std::vector<long,_std::allocator<long>_>::vector
              (in_stack_fffffffffffffa80,
               (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa78._M_cur);
    std::vector<long,_std::allocator<long>_>::vector
              (in_stack_fffffffffffffa80,
               (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa78._M_cur);
    end_to_end_solution((GraphContigger *)iVar6._M_current,p,in_stack_fffffffffffffcf8);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffa40._M_current);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffa40._M_current);
    sVar2 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)&stack0xfffffffffffffce8);
    local_56a = false;
    if (sVar2 != 0) {
      in_stack_fffffffffffffa80 = &local_288;
      local_358 = (vector<long,_std::allocator<long>_> *)
                  std::
                  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           *)in_stack_fffffffffffffa28);
      local_360 = (vector<long,_std::allocator<long>_> *)
                  std::
                  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         *)in_stack_fffffffffffffa28);
      local_350 = (vector<long,_std::allocator<long>_> *)
                  std::
                  find<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,std::vector<long,std::allocator<long>>>
                            (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                             (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa38);
      local_368 = (vector<long,_std::allocator<long>_> *)
                  std::
                  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         *)in_stack_fffffffffffffa28);
      local_56a = __gnu_cxx::operator==
                            ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                              *)in_stack_fffffffffffffa30,
                             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                              *)in_stack_fffffffffffffa28);
    }
    if (local_56a != false) {
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::push_back((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)in_stack_fffffffffffffa40._M_current,(value_type *)in_stack_fffffffffffffa38);
    }
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffa40._M_current);
    __gnu_cxx::
    __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
    ::operator++(&local_2f0);
  }
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                0x4c0618);
  local_3a8 = &local_288;
  local_3b0._M_current =
       (vector<long,_std::allocator<long>_> *)
       std::
       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
       ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)in_stack_fffffffffffffa28);
  local_3b8 = (vector<long,_std::allocator<long>_> *)
              std::
              vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)in_stack_fffffffffffffa28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                             *)in_stack_fffffffffffffa30,
                            (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                             *)in_stack_fffffffffffffa28), bVar1) {
    local_3c0 = __gnu_cxx::
                __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                ::operator*(&local_3b0);
    std::vector<long,_std::allocator<long>_>::operator[](local_3c0,0);
    pVar9 = std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>::
            emplace<long_const&>
                      ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                        *)in_stack_fffffffffffffa40._M_current,(long *)in_stack_fffffffffffffa38);
    in_stack_fffffffffffffa78._M_cur =
         (__node_type *)pVar9.first.super__Node_iterator_base<long,_false>._M_cur;
    local_3c8 = pVar9.second;
    local_3d0._M_cur = in_stack_fffffffffffffa78._M_cur;
    __gnu_cxx::
    __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
    ::operator++(&local_3b0);
  }
  local_3d8 = &local_288;
  local_3e0._M_current =
       (vector<long,_std::allocator<long>_> *)
       std::
       vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
       ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)in_stack_fffffffffffffa28);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         *)in_stack_fffffffffffffa28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                             *)in_stack_fffffffffffffa30,
                            (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                             *)in_stack_fffffffffffffa28), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
    ::operator*(&local_3e0);
    std::vector<long,_std::allocator<long>_>::back(&in_stack_fffffffffffffa30->nodes);
    pVar9 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
            emplace<long>((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                           *)in_stack_fffffffffffffa40._M_current,(long *)in_stack_fffffffffffffa38)
    ;
    in_stack_fffffffffffffbf8._M_cur =
         (__node_type *)pVar9.first.super__Node_iterator_base<long,_false>._M_cur;
    __gnu_cxx::
    __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
    ::operator++(&local_3e0);
  }
  sVar2 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::size((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)&local_288);
  sVar3 = std::vector<long,_std::allocator<long>_>::size(&local_40);
  if (sVar2 == sVar3 >> 1) {
    sVar7 = std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
            size((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x4c0803);
    sVar2 = std::vector<long,_std::allocator<long>_>::size(&local_40);
    if (sVar7 != sVar2) goto LAB_004c0b6b;
    nodes = &local_288;
    iVar6 = std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     *)in_stack_fffffffffffffa28);
    local_420 = (vector<long,_std::allocator<long>_> *)
                std::
                vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       *)in_stack_fffffffffffffa28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                               *)in_stack_fffffffffffffa30,
                              (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                               *)in_stack_fffffffffffffa28), bVar1) {
      local_428 = __gnu_cxx::
                  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                  ::operator*((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                               *)&stack0xfffffffffffffbe8);
      std::vector<long,_std::allocator<long>_>::vector
                (in_stack_fffffffffffffa80,
                 (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa78._M_cur);
      SequenceDistanceGraphPath::SequenceDistanceGraphPath
                ((SequenceDistanceGraphPath *)in_stack_fffffffffffffa40._M_current,
                 in_stack_fffffffffffffa38,&in_stack_fffffffffffffa30->nodes);
      SequenceDistanceGraphPath::sequence_abi_cxx11_(in_stack_fffffffffffffce8);
      SequenceDistanceGraphPath::~SequenceDistanceGraphPath((SequenceDistanceGraphPath *)0x4c08fd);
      std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffa40._M_current);
      std::__cxx11::string::~string(local_448);
      __gnu_cxx::
      __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
      ::operator++((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                    *)&stack0xfffffffffffffbe8);
    }
    local_490 = &local_288;
    local_498._M_current =
         (vector<long,_std::allocator<long>_> *)
         std::
         vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)in_stack_fffffffffffffa28);
    local_4a0 = (vector<long,_std::allocator<long>_> *)
                std::
                vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       *)in_stack_fffffffffffffa28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                               *)in_stack_fffffffffffffa30,
                              (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                               *)in_stack_fffffffffffffa28), bVar1) {
      local_4a8 = __gnu_cxx::
                  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                  ::operator*(&local_498);
      in_stack_fffffffffffffa40._M_current = &local_28->nodes;
      std::vector<long,_std::allocator<long>_>::vector
                (in_stack_fffffffffffffa80,
                 (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffa78._M_cur);
      GraphEditor::queue_path_detachment
                ((GraphEditor *)in_stack_fffffffffffffbf8._M_cur,nodes,
                 SUB81((ulong)iVar6._M_current >> 0x38,0));
      std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffa40._M_current);
      __gnu_cxx::
      __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
      ::operator++(&local_498);
    }
    local_4c8 = local_18 + 1;
    local_4d0._M_current =
         (NodeView *)
         std::vector<NodeView,_std::allocator<NodeView>_>::begin
                   ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffa28);
    std::vector<NodeView,_std::allocator<NodeView>_>::end
              ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffa28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                               *)in_stack_fffffffffffffa30,
                              (__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>
                               *)in_stack_fffffffffffffa28), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
                operator*(&local_4d0);
      in_stack_fffffffffffffa30 = local_28;
      NodeView::node_id(this_00);
      GraphEditor::queue_node_deletion(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      __gnu_cxx::__normal_iterator<NodeView_*,_std::vector<NodeView,_std::allocator<NodeView>_>_>::
      operator++(&local_4d0);
    }
    local_1 = 1;
  }
  else {
LAB_004c0b6b:
    local_1 = 0;
  }
  local_484 = 1;
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x4c0b8b);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)in_stack_fffffffffffffa40._M_current);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)in_stack_fffffffffffffa40._M_current);
  std::
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  ::~unordered_map((unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
                    *)0x4c0bb2);
  std::
  unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
  ::~unordered_map((unordered_map<long,_std::vector<long,_std::allocator<long>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<long,_std::allocator<long>_>_>_>_>
                    *)0x4c0bbf);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffa40._M_current);
LAB_004c0c1e:
  return (bool)(local_1 & 1);
}

Assistant:

bool GraphContigger::solve_unclassified(TangleView &t, Strider &s, GraphEditor &ge){
    if (t.frontiers.size()+t.internals.size()>200) return false;
    std::vector<sgNodeID_t> fnids;
    for (const auto& f: t.frontiers) fnids.push_back(f.node_id());

//    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> sols;
//    for (const auto& fnid: fnids) sols.insert(std::make_pair(fnid, std::vector<sgNodeID_t>()));
    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> fs;
    for (const auto&f: t.frontiers) {
        fs.insert(std::make_pair(-f.node_id(), s.stride_out_in_order(-f.node_id()).nodes));
    }

    std::unordered_map<sgNodeID_t , std::vector<sgNodeID_t>> ns;
    for (const auto&nv: t.internals){

        std::vector<sgNodeID_t> tpath;
        auto stride_back = s.stride_out_in_order(-nv.node_id()).nodes;
        for (auto i=stride_back.rbegin(); i<stride_back.rend()-1; ++i){
            tpath.push_back(*i*-1);
        }
        for (const auto &i: s.stride_out_in_order(nv.node_id()).nodes){
            tpath.push_back(i-1);
        }
        ns.insert(std::make_pair(nv.node_id(), tpath));
    }

    std::vector<std::vector<sgNodeID_t >> sols;
    std::vector<std::vector<sgNodeID_t>> map_values;
    for (const auto &v: fs){map_values.push_back(v.second);}
    for (const auto &v: ns){map_values.push_back(v.second);}


    for (const auto& x: map_values){
        auto sol=end_to_end_solution(x, fnids);
        if (sol.size()>0 and std::find(sols.begin(), sols.end(), sol)==sols.end()){
            sols.push_back(sol);
        }
    }

    std::unordered_set<sgNodeID_t> temp_set;
    for (const auto &x: sols){
        temp_set.emplace(x[0]);
    }
    for (const auto &x: sols){
        temp_set.emplace(-x.back());
    }

    if (sols.size() == fnids.size()/2 and temp_set.size() == fnids.size()){
        for (const auto &x: sols){
            try {
                auto ps=SequenceDistanceGraphPath(ws.sdg,x).sequence();
            } catch (...) {
                return false;
            }
        }
        for (const auto &x: sols) ge.queue_path_detachment(x, true);
        for (const auto &x: t.internals) ge.queue_node_deletion(x.node_id());
        return true;
    }
    return false;
}